

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

Instruction * Instruction::get(Addr addr,int size)

{
  Addr addr_00;
  mapped_type *ppIVar1;
  mapped_type this;
  allocator local_41;
  Addr addr_local;
  string local_38;
  
  addr_local = addr;
  ppIVar1 = std::
            map<unsigned_long,_Instruction_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Instruction_*>_>_>
            ::operator[](&m_instrsMap,&addr_local);
  this = *ppIVar1;
  if (this == (mapped_type)0x0) {
    this = (mapped_type)operator_new(0x38);
    addr_00 = addr_local;
    std::__cxx11::string::string((string *)&local_38,"???",&local_41);
    Instruction(this,addr_00,size,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    ppIVar1 = std::
              map<unsigned_long,_Instruction_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Instruction_*>_>_>
              ::operator[](&m_instrsMap,&addr_local);
    *ppIVar1 = this;
  }
  else if (this->m_size == 0) {
    this->m_size = size;
  }
  else if (this->m_size != size) {
    __assert_fail("instr->m_size == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/Instruction.cpp"
                  ,0x2d,"static Instruction *Instruction::get(Addr, int)");
  }
  return this;
}

Assistant:

Instruction* Instruction::get(Addr addr, int size) {
	Instruction* instr = m_instrsMap[addr];
	if (instr) {
		if (instr->m_size == 0)
			instr->m_size = size;
		else
			assert(instr->m_size == size);
	} else {
		instr = new Instruction(addr, size);
		m_instrsMap[addr] = instr;
	}

	return instr;
}